

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

bin_t * arena_bin_choose_lock(tsdn_t *tsdn,arena_t *arena,szind_t binind,uint *binshard)

{
  uint uVar1;
  long lVar2;
  uint *in_RCX;
  uint in_EDX;
  malloc_mutex_t *in_RSI;
  tsdn_t *in_RDI;
  bin_t *bin;
  uint8_t state_1;
  uint8_t state;
  
  if (in_RDI != (tsdn_t *)0x0) {
    if ((in_RDI->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena != (arena_t *)0x0)
    {
      *in_RCX = (uint)(in_RDI->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_binshards.
                      binshard[in_EDX];
      goto LAB_001142da;
    }
  }
  *in_RCX = 0;
LAB_001142da:
  lVar2 = *(long *)((long)&in_RSI[0x104].field_0 + (ulong)in_EDX * 8 + 0x48);
  uVar1 = *in_RCX;
  malloc_mutex_lock(in_RDI,in_RSI);
  return (bin_t *)(lVar2 + (ulong)uVar1 * 0x118);
}

Assistant:

bin_t *
arena_bin_choose_lock(tsdn_t *tsdn, arena_t *arena, szind_t binind,
    unsigned *binshard) {
	bin_t *bin;
	if (tsdn_null(tsdn) || tsd_arena_get(tsdn_tsd(tsdn)) == NULL) {
		*binshard = 0;
	} else {
		*binshard = tsd_binshardsp_get(tsdn_tsd(tsdn))->binshard[binind];
	}
	assert(*binshard < bin_infos[binind].n_shards);
	bin = &arena->bins[binind].bin_shards[*binshard];
	malloc_mutex_lock(tsdn, &bin->lock);

	return bin;
}